

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

TraceStats * __thiscall
perfetto::TracingServiceImpl::GetTraceStats
          (TraceStats *__return_storage_ptr__,TracingServiceImpl *this,
          TracingSession *tracing_session)

{
  ulong uVar1;
  _Head_base<0UL,_perfetto::protos::gen::TraceStats_FilterStats_*,_false> _Var2;
  bitset<5UL> bVar3;
  BufferID *pBVar4;
  pointer pTVar5;
  TraceBuffer *pTVar6;
  BufferID *pBVar7;
  
  protos::gen::TraceStats::TraceStats(__return_storage_ptr__);
  __return_storage_ptr__->producers_connected_ =
       (uint32_t)(this->producers_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar1 = (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 4;
  __return_storage_ptr__->producers_seen_ = (ulong)this->last_producer_id_;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0xc;
  __return_storage_ptr__->data_sources_registered_ =
       (uint32_t)(this->data_sources_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x1c;
  __return_storage_ptr__->data_sources_seen_ = this->last_data_source_instance_id_;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x3c;
  __return_storage_ptr__->tracing_sessions_ =
       (uint32_t)(this->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x7c;
  __return_storage_ptr__->total_buffers_ =
       (uint32_t)(this->buffers_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0xfc;
  __return_storage_ptr__->chunks_discarded_ = this->chunks_discarded_;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x1fc;
  __return_storage_ptr__->patches_discarded_ = this->patches_discarded_;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x3fc;
  __return_storage_ptr__->invalid_packets_ = tracing_session->invalid_packets;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x7fc;
  __return_storage_ptr__->flushes_requested_ = tracing_session->flushes_requested;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x17fc;
  __return_storage_ptr__->flushes_succeeded_ = tracing_session->flushes_succeeded;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x37fc;
  __return_storage_ptr__->flushes_failed_ = tracing_session->flushes_failed;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0x77fc;
  __return_storage_ptr__->final_flush_outcome_ = tracing_session->final_flush_outcome;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0xf7fc;
  if ((tracing_session->trace_filter)._M_t.
      super___uniq_ptr_impl<protozero::MessageFilter,_std::default_delete<protozero::MessageFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_protozero::MessageFilter_*,_std::default_delete<protozero::MessageFilter>_>
      .super__Head_base<0UL,_protozero::MessageFilter_*,_false>._M_head_impl != (MessageFilter *)0x0
     ) {
    (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar1 | 0xfffc;
    _Var2._M_head_impl =
         (__return_storage_ptr__->filter_stats_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceStats_FilterStats,_std::default_delete<perfetto::protos::gen::TraceStats_FilterStats>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceStats_FilterStats_*,_std::default_delete<perfetto::protos::gen::TraceStats_FilterStats>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceStats_FilterStats_*,_false>._M_head_impl
    ;
    (_Var2._M_head_impl)->input_packets_ = tracing_session->filter_input_packets;
    bVar3.super__Base_bitset<1UL>._M_w = ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL>
    ;
    ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)((ulong)bVar3.super__Base_bitset<1UL>._M_w | 2);
    (_Var2._M_head_impl)->input_bytes_ = tracing_session->filter_input_bytes;
    ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)((ulong)bVar3.super__Base_bitset<1UL>._M_w | 6);
    (_Var2._M_head_impl)->output_bytes_ = tracing_session->filter_output_bytes;
    ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)((ulong)bVar3.super__Base_bitset<1UL>._M_w | 0xe);
    (_Var2._M_head_impl)->errors_ = tracing_session->filter_errors;
    ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)((ulong)bVar3.super__Base_bitset<1UL>._M_w | 0x1e);
  }
  pBVar7 = (tracing_session->buffers_index).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar4 = (tracing_session->buffers_index).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar7 != pBVar4) {
    do {
      pTVar6 = GetBufferByID(this,*pBVar7);
      if (pTVar6 != (TraceBuffer *)0x0) {
        std::
        vector<perfetto::protos::gen::TraceStats_BufferStats,_std::allocator<perfetto::protos::gen::TraceStats_BufferStats>_>
        ::emplace_back<>(&__return_storage_ptr__->buffer_stats_);
        pTVar5 = (__return_storage_ptr__->buffer_stats_).
                 super__Vector_base<perfetto::protos::gen::TraceStats_BufferStats,_std::allocator<perfetto::protos::gen::TraceStats_BufferStats>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        memcpy(&pTVar5[-1].buffer_size_,&(pTVar6->stats_).buffer_size_,0x98);
        ::std::__cxx11::string::_M_assign((string *)&pTVar5[-1].unknown_fields_);
        pTVar5[-1]._has_field_.super__Base_bitset<1UL>._M_w =
             (pTVar6->stats_)._has_field_.super__Base_bitset<1UL>._M_w;
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

TraceStats TracingServiceImpl::GetTraceStats(TracingSession* tracing_session) {
  TraceStats trace_stats;
  trace_stats.set_producers_connected(static_cast<uint32_t>(producers_.size()));
  trace_stats.set_producers_seen(last_producer_id_);
  trace_stats.set_data_sources_registered(
      static_cast<uint32_t>(data_sources_.size()));
  trace_stats.set_data_sources_seen(last_data_source_instance_id_);
  trace_stats.set_tracing_sessions(
      static_cast<uint32_t>(tracing_sessions_.size()));
  trace_stats.set_total_buffers(static_cast<uint32_t>(buffers_.size()));
  trace_stats.set_chunks_discarded(chunks_discarded_);
  trace_stats.set_patches_discarded(patches_discarded_);
  trace_stats.set_invalid_packets(tracing_session->invalid_packets);
  trace_stats.set_flushes_requested(tracing_session->flushes_requested);
  trace_stats.set_flushes_succeeded(tracing_session->flushes_succeeded);
  trace_stats.set_flushes_failed(tracing_session->flushes_failed);
  trace_stats.set_final_flush_outcome(tracing_session->final_flush_outcome);

  if (tracing_session->trace_filter) {
    auto* filt_stats = trace_stats.mutable_filter_stats();
    filt_stats->set_input_packets(tracing_session->filter_input_packets);
    filt_stats->set_input_bytes(tracing_session->filter_input_bytes);
    filt_stats->set_output_bytes(tracing_session->filter_output_bytes);
    filt_stats->set_errors(tracing_session->filter_errors);
  }

  for (BufferID buf_id : tracing_session->buffers_index) {
    TraceBuffer* buf = GetBufferByID(buf_id);
    if (!buf) {
      PERFETTO_DFATAL("Buffer not found.");
      continue;
    }
    *trace_stats.add_buffer_stats() = buf->stats();
  }  // for (buf in session).
  return trace_stats;
}